

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Time.cpp
# Opt level: O1

string_view slang::timeUnitToSuffix(TimeUnit unit)

{
  string_view sVar1;
  
  sVar1._M_str = *(char **)(&DAT_00636298 + (long)(char)unit * 8);
  sVar1._M_len = *(size_t *)(&DAT_004f51b8 + (long)(char)unit * 8);
  return sVar1;
}

Assistant:

std::string_view timeUnitToSuffix(TimeUnit unit) {
    switch (unit) {
        case TimeUnit::Seconds:
            return "s";
        case TimeUnit::Milliseconds:
            return "ms";
        case TimeUnit::Microseconds:
            return "us";
        case TimeUnit::Nanoseconds:
            return "ns";
        case TimeUnit::Picoseconds:
            return "ps";
        case TimeUnit::Femtoseconds:
            return "fs";
    }
    SLANG_UNREACHABLE;
}